

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipCommentAndWhitespaceAndNewline
          (AsciiParser *this,bool allow_semicolon)

{
  int *piVar1;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  char d;
  char c;
  char local_2a;
  char local_29;
  
LAB_002edcd3:
  do {
    while( true ) {
      bVar3 = Eof(this);
      if (bVar3) {
        return true;
      }
      bVar3 = Char1(this,&local_29);
      if (!bVar3) {
        return false;
      }
      if (((local_29 != '\t') && (local_29 != '\f')) && (local_29 != ' ')) break;
LAB_002edd2e:
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
    }
    if (local_29 != '#') {
      if (local_29 == ';' && allow_semicolon) goto LAB_002edd2e;
      if (local_29 == '\r') {
        if (this->_sr->idx_ < this->_sr->length_ - 1) {
          bVar3 = Char1(this,&local_2a);
          if (!bVar3) {
            return false;
          }
          if (local_2a != '\n') {
            pSVar2 = this->_sr;
            if ((long)pSVar2->idx_ < 1) {
              return false;
            }
            uVar4 = pSVar2->idx_ - 1;
            if (pSVar2->length_ < uVar4) {
              return false;
            }
            pSVar2->idx_ = uVar4;
          }
        }
      }
      else if (local_29 != '\n') {
        pSVar2 = this->_sr;
        if ((long)pSVar2->idx_ < 1) {
          return false;
        }
        uVar4 = pSVar2->idx_ - 1;
        if (pSVar2->length_ < uVar4) {
          return false;
        }
        pSVar2->idx_ = uVar4;
        return true;
      }
      (this->_curr_cursor).col = 0;
      (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
      goto LAB_002edcd3;
    }
    bVar3 = SkipUntilNewline(this);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool AsciiParser::SkipCommentAndWhitespaceAndNewline(
    const bool allow_semicolon) {
  // Skip multiple line of comments.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if (c == '#') {
      if (!SkipUntilNewline()) {
        return false;
      }
    } else if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // std::cout << "unwind\n";
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}